

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall WeightedReservoir_Basic_Test::TestBody(WeightedReservoir_Basic_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  float *__last;
  float fVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  Float sumW;
  int64_t nTrials;
  atomic<int> count [16];
  int i;
  float weights [16];
  int n;
  RNG rng;
  RNG *in_stack_fffffffffffffe50;
  AssertionResult *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  char *in_stack_fffffffffffffe68;
  AssertionResult *this_01;
  Type in_stack_fffffffffffffe7c;
  AssertionResult local_148;
  Message *in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult local_118;
  int local_104;
  undefined4 in_stack_ffffffffffffff04;
  double *in_stack_ffffffffffffff08;
  float *expr2;
  char *expr1;
  function<void_(long,_long)> *in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  int64_t start;
  undefined1 local_b8 [64];
  int local_6c;
  float local_68 [19];
  undefined4 local_1c;
  RNG local_18;
  
  pbrt::RNG::RNG(&local_18);
  local_1c = 0x10;
  for (local_6c = 0; local_6c < 0x10; local_6c = local_6c + 1) {
    fVar2 = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffe50);
    fVar2 = pbrt::Sqr<float>(fVar2);
    local_68[local_6c] = fVar2 + 0.05;
  }
  local_b8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  start = 1000000;
  expr2 = local_68;
  expr1 = local_b8;
  std::function<void(long,long)>::function<WeightedReservoir_Basic_Test::TestBody()::__0,void>
            ((function<void_(long,_long)> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (anon_class_16_2_1869d59d *)in_stack_fffffffffffffe58);
  pbrt::ParallelFor(start,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x64547e);
  this_00 = (AssertHelper *)std::begin<float,16ul>((float (*) [16])local_68);
  __last = std::end<float,16ul>((float (*) [16])local_68);
  fVar2 = std::accumulate<float*,float>((float *)this_00,__last,0.0);
  for (local_104 = 0; local_104 < 0x10; local_104 = local_104 + 1) {
    std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe58);
    this_01 = &local_118;
    testing::internal::CmpHelperLE<double,float>
              (expr1,(char *)expr2,in_stack_ffffffffffffff08,
               (float *)CONCAT44(in_stack_ffffffffffffff04,fVar2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    in_stack_fffffffffffffe7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe68 =
           testing::AssertionResult::failure_message((AssertionResult *)0x6455dd);
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffe7c,&this_01->success_,
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
      testing::Message::~Message((Message *)0x64563a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x645692);
    std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe58 = &local_148;
    testing::internal::CmpHelperGE<double,float>
              (expr1,(char *)expr2,in_stack_ffffffffffffff08,
               (float *)CONCAT44(in_stack_ffffffffffffff04,fVar2));
    in_stack_fffffffffffffe67 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe58);
    if (!(bool)in_stack_fffffffffffffe67) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe50 =
           (RNG *)testing::AssertionResult::failure_message((AssertionResult *)0x645776);
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffe7c,&this_01->success_,
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
      testing::Message::~Message((Message *)0x6457c4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x645810);
  }
  return;
}

Assistant:

TEST(WeightedReservoir, Basic) {
    RNG rng;
    constexpr int n = 16;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .05 + Sqr(rng.Uniform<Float>());

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 16;
#endif
        RNG rng(3 * start);
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs(i);
            int perm[n];
            for (int j = 0; j < n; ++j)
                perm[j] = j;

            for (int j = 0; j < n; ++j) {
                int index = perm[j];
                wrs.Add(index, weights[index]);
            }

            int index = wrs.GetSample();
            ASSERT_TRUE(index >= 0 && index < n);
            ++localCount[index];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.97 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.03 * count[i] / double(nTrials), weights[i] / sumW);
    }
}